

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O2

uint32_t __thiscall
cppnet::BufferBlock::Read(BufferBlock *this,shared_ptr<cppnet::InnerBuffer> *buffer,uint32_t len)

{
  _func_int *p_Var1;
  int iVar2;
  int iVar3;
  element_type *peVar5;
  uint uVar6;
  void *data2;
  void *data1;
  uint32_t len2;
  uint32_t len1;
  void *local_40;
  void *local_38;
  uint32_t local_30;
  uint32_t local_2c;
  _func_int **pp_Var4;
  
  if (this->_buffer_start == (char *)0x0) {
    return 0;
  }
  if ((this->_can_read == false) && (this->_read == this->_write)) {
    return 0;
  }
  if (len == 0) {
    len = (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[8])(this);
  }
  local_38 = (void *)0x0;
  local_40 = (void *)0x0;
  local_2c = 0;
  local_30 = 0;
  GetUseMemoryBlock(this,&local_38,&local_2c,&local_40,&local_30);
  uVar6 = local_30;
  if (len < local_30 + local_2c) {
    peVar5 = (buffer->super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var1 = (peVar5->super_Buffer)._vptr_Buffer[10];
    uVar6 = len - local_2c;
    if (len < local_2c) {
      uVar6 = (*p_Var1)(peVar5,local_38,(ulong)len);
      goto LAB_0011ee96;
    }
    iVar2 = (*p_Var1)(peVar5,local_38);
    peVar5 = (buffer->super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pp_Var4 = (peVar5->super_Buffer)._vptr_Buffer;
  }
  else {
    peVar5 = (buffer->super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    iVar2 = (*(peVar5->super_Buffer)._vptr_Buffer[10])(peVar5,local_38);
    peVar5 = (buffer->super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    pp_Var4 = (peVar5->super_Buffer)._vptr_Buffer;
  }
  iVar3 = (*pp_Var4[10])(peVar5,local_40,(ulong)uVar6);
  uVar6 = iVar3 + iVar2;
LAB_0011ee96:
  (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[6])(this,(ulong)uVar6);
  return uVar6;
}

Assistant:

uint32_t BufferBlock::Read(std::shared_ptr<InnerBuffer> buffer, uint32_t len) {
    if (!_buffer_start) {
        return 0;
    }

    if(!_can_read && _read == _write) {
        return 0;
    }

    if (len == 0) {
        len = GetCanReadLength();
    }

    void* data1 = nullptr, *data2 = nullptr;
    uint32_t len1 = 0, len2 = 0;

    GetUseMemoryBlock(data1, len1, data2, len2);
    uint32_t total_size = len1 + len2;
    uint32_t read_done_size = 0;
    
    // read all data
    if (len >= total_size) {
        read_done_size += buffer->Write((char*)data1, len1);
        read_done_size += buffer->Write((char*)data2, len2);

    // write part of data
    } else if (len < total_size && len >= len1) {
        read_done_size += buffer->Write((char*)data1, len1);
        read_done_size += buffer->Write((char*)data2, len - len1);

    // write part of data
    } else {
        read_done_size += buffer->Write((char*)data1, len);
    }

    MoveReadPt(read_done_size);
    return read_done_size;
}